

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vbpermq_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  byte bVar1;
  uint64_t mask;
  ulong uStack_30;
  int index;
  uint64_t perm;
  int i;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  uStack_30 = 0;
  for (perm._4_4_ = 0xf; -1 < perm._4_4_; perm._4_4_ = perm._4_4_ + -1) {
    bVar1 = b->u8[0xf - perm._4_4_];
    if ((bVar1 < 0x80) &&
       ((a->u64[(int)(uint)((bVar1 & 0x40) == 0)] & 1L << (0x3f - (bVar1 & 0x3f) & 0x3f)) != 0)) {
      uStack_30 = (long)(0x8000 >> ((byte)perm._4_4_ & 0x1f)) | uStack_30;
    }
  }
  r->u64[1] = uStack_30;
  r->u64[0] = 0;
  return;
}

Assistant:

void helper_vbpermq(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    uint64_t perm = 0;

    VECTOR_FOR_INORDER_I(i, u8) {
        int index = VBPERMQ_INDEX(b, i);

        if (index < 128) {
            uint64_t mask = (1ull << (63 - (index & 0x3F)));
            if (a->u64[VBPERMQ_DW(index)] & mask) {
                perm |= (0x8000 >> i);
            }
        }
    }

    r->VsrD(0) = perm;
    r->VsrD(1) = 0;
}